

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftzopen.c
# Opt level: O0

int ft_lzwstate_refill(FT_LzwState state)

{
  FT_ULong FVar1;
  FT_ULong count;
  FT_LzwState state_local;
  
  if (state->in_eof == 0) {
    FVar1 = FT_Stream_TryRead(state->source,state->buf_tab,(ulong)state->num_bits);
    state->buf_size = (FT_UInt)FVar1;
    state->buf_total = FVar1 + state->buf_total;
    state->in_eof = (uint)(FVar1 < state->num_bits);
    state->buf_offset = 0;
    state->buf_size = state->buf_size << 3;
    if (state->num_bits < state->buf_size) {
      state->buf_size = state->buf_size - (state->num_bits - 1);
      if (FVar1 == 0) {
        state_local._4_4_ = -1;
      }
      else {
        state_local._4_4_ = 0;
      }
    }
    else {
      state_local._4_4_ = -1;
    }
  }
  else {
    state_local._4_4_ = -1;
  }
  return state_local._4_4_;
}

Assistant:

static int
  ft_lzwstate_refill( FT_LzwState  state )
  {
    FT_ULong  count;


    if ( state->in_eof )
      return -1;

    count = FT_Stream_TryRead( state->source,
                               state->buf_tab,
                               state->num_bits );  /* WHY? */

    state->buf_size   = (FT_UInt)count;
    state->buf_total += count;
    state->in_eof     = FT_BOOL( count < state->num_bits );
    state->buf_offset = 0;

    state->buf_size <<= 3;
    if ( state->buf_size > state->num_bits )
      state->buf_size -= state->num_bits - 1;
    else
      return -1; /* not enough data */

    if ( count == 0 )  /* end of file */
      return -1;

    return 0;
  }